

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word Gia_ObjComputeTruthTable6(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp,Vec_Wrd_t *vTruths)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  long lVar4;
  word *pwVar5;
  int iVar6;
  
  if (6 < vSupp->nSize) {
    __assert_fail("Vec_IntSize(vSupp) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x19b,
                  "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  uVar3 = (uint)*(undefined8 *)pObj;
  if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x19c,
                  "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  if ((uVar3 >> 0x1e & 1) != 0) {
    __assert_fail("!pObj->fMark0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x19d,
                  "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  vTruths->nSize = 0;
  Gia_ManIncrementTravId(p);
  if (0 < vSupp->nSize) {
    pwVar5 = s_Truths6;
    lVar4 = 0;
    do {
      iVar6 = vSupp->pArray[lVar4];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar6;
      uVar3 = (uint)*(undefined8 *)pGVar1;
      if (((uVar3 >> 0x1e & 1) == 0) &&
         (((~uVar3 & 0x9fffffff) != 0 ||
          ((int)((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff) <
           p->vCis->nSize - p->nRegs)))) {
        __assert_fail("pLeaf->fMark0 || Gia_ObjIsRo(p, pLeaf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x1a2,
                      "word Gia_ObjComputeTruthTable6(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Wrd_t *)"
                     );
      }
      pGVar1->Value = vTruths->nSize;
      Vec_WrdPush(vTruths,*pwVar5);
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar6 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar6) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      p->pTravIds[iVar6] = p->nTravIds;
      lVar4 = lVar4 + 1;
      pwVar5 = pwVar5 + 1;
    } while (lVar4 < vSupp->nSize);
  }
  Gia_ObjComputeTruthTable6_rec(p,pObj,vTruths);
  if (0 < (long)vTruths->nSize) {
    return vTruths->pArray[(long)vTruths->nSize + -1];
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1f1,"word Vec_WrdEntryLast(Vec_Wrd_t *)");
}

Assistant:

word Gia_ObjComputeTruthTable6( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pLeaf;
    int i;
    assert( Vec_IntSize(vSupp) <= 6 );
    assert( Gia_ObjIsAnd(pObj) );
    assert( !pObj->fMark0 );
    Vec_WrdClear( vTruths );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObjVec( vSupp, p, pLeaf, i )
    {
        assert( pLeaf->fMark0 || Gia_ObjIsRo(p, pLeaf) );
        pLeaf->Value = Vec_WrdSize(vTruths);
        Vec_WrdPush( vTruths, s_Truth6[i] );
        Gia_ObjSetTravIdCurrent(p, pLeaf);
    }
    Gia_ObjComputeTruthTable6_rec( p, pObj, vTruths );
    return Vec_WrdEntryLast( vTruths );
}